

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Writer.cpp
# Opt level: O0

void __thiscall
adios2::core::engine::BP5Writer::WriteMetadataFileIndex
          (BP5Writer *this,uint64_t MetaDataPos,uint64_t MetaDataSize)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  size_type sVar4;
  long lVar5;
  reference this_00;
  vector<char,_std::allocator<char>_> *this_01;
  long in_RSI;
  long in_RDI;
  size_t flushNum;
  int writer;
  uchar record;
  uint64_t d;
  size_t pos;
  vector<char,_std::allocator<char>_> buf;
  size_t bufsize;
  undefined1 in_stack_000005d7;
  string *in_stack_000005d8;
  size_t *in_stack_000005e0;
  vector<char,_std::allocator<char>_> *in_stack_000005e8;
  BP5Writer *in_stack_000005f0;
  allocator_type *in_stack_fffffffffffffee0;
  size_type in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  size_t in_stack_fffffffffffffef8;
  size_t elements;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffff08;
  _Vector_impl *in_stack_ffffffffffffff10;
  ulong in_stack_ffffffffffffff68;
  ulong uVar6;
  int transportIndex;
  int iVar7;
  int iVar8;
  undefined4 in_stack_ffffffffffffff74;
  char *in_stack_ffffffffffffff78;
  TransportMan *in_stack_ffffffffffffff80;
  _Vector_impl local_58;
  allocator<char> local_39;
  vector<char,_std::allocator<char>_> local_38;
  long local_20;
  long local_10;
  
  local_10 = in_RSI;
  sVar4 = std::
          vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
          ::size((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                  *)(in_RDI + 0xc48));
  iVar2 = helper::Comm::Size((Comm *)0xa8200b);
  lVar5 = ((sVar4 * 2 + 1) * (long)iVar2 + 4) * 8;
  local_20 = lVar5 + 1;
  if (local_10 == 0) {
    local_20 = lVar5 + 0x41;
  }
  bVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     in_stack_fffffffffffffee0);
  if (!bVar1) {
    iVar2 = helper::Comm::Size((Comm *)0xa82078);
    local_20 = (long)(iVar2 + 4) * 8 + 1 + local_20;
  }
  std::allocator<char>::allocator();
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),in_stack_fffffffffffffee8
             ,in_stack_fffffffffffffee0);
  std::allocator<char>::~allocator(&local_39);
  local_58.super__Tp_alloc_type = (_Tp_alloc_type)0x0;
  local_58._1_7_ = 0;
  if (local_10 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&stack0xffffffffffffff78,"Index Table",
               (allocator *)&stack0xffffffffffffff77);
    MakeHeader(in_stack_000005f0,in_stack_000005e8,in_stack_000005e0,in_stack_000005d8,
               (bool)in_stack_000005d7);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff78);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff77);
  }
  bVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     in_stack_fffffffffffffee0);
  if (!bVar1) {
    helper::CopyToBuffer<unsigned_char>
              ((vector<char,_std::allocator<char>_> *)in_stack_ffffffffffffff10,
               (size_t *)in_stack_ffffffffffffff08,
               (uchar *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
               in_stack_fffffffffffffef8);
    helper::Comm::Size((Comm *)0xa8223d);
    helper::CopyToBuffer<unsigned_long>
              ((vector<char,_std::allocator<char>_> *)in_stack_ffffffffffffff10,
               (size_t *)in_stack_ffffffffffffff08,
               (unsigned_long *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
               in_stack_fffffffffffffef8);
    helper::Comm::Size((Comm *)0xa8228c);
    in_stack_ffffffffffffff08 = &local_38;
    in_stack_ffffffffffffff10 = &local_58;
    helper::CopyToBuffer<unsigned_long>
              ((vector<char,_std::allocator<char>_> *)in_stack_ffffffffffffff10,
               (size_t *)in_stack_ffffffffffffff08,
               (unsigned_long *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
               in_stack_fffffffffffffef8);
    helper::CopyToBuffer<unsigned_long>
              ((vector<char,_std::allocator<char>_> *)in_stack_ffffffffffffff10,
               (size_t *)in_stack_ffffffffffffff08,
               (unsigned_long *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
               in_stack_fffffffffffffef8);
    helper::CopyToBuffer<unsigned_long>
              ((vector<char,_std::allocator<char>_> *)in_stack_ffffffffffffff10,
               (size_t *)in_stack_ffffffffffffff08,
               (unsigned_long *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
               in_stack_fffffffffffffef8);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0xa82352);
    helper::Comm::Size((Comm *)0xa82368);
    helper::CopyToBuffer<unsigned_long>
              ((vector<char,_std::allocator<char>_> *)in_stack_ffffffffffffff10,
               (size_t *)in_stack_ffffffffffffff08,
               (unsigned_long *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
               in_stack_fffffffffffffef8);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::clear
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0xa823a3);
  }
  helper::CopyToBuffer<unsigned_char>
            ((vector<char,_std::allocator<char>_> *)in_stack_ffffffffffffff10,
             (size_t *)in_stack_ffffffffffffff08,
             (uchar *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
             in_stack_fffffffffffffef8);
  sVar4 = std::
          vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
          ::size((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                  *)(in_RDI + 0xc48));
  elements = sVar4 * 2 + 1;
  iVar2 = helper::Comm::Size((Comm *)0xa82417);
  helper::CopyToBuffer<unsigned_long>
            ((vector<char,_std::allocator<char>_> *)in_stack_ffffffffffffff10,
             (size_t *)in_stack_ffffffffffffff08,
             (unsigned_long *)CONCAT44(iVar2,in_stack_ffffffffffffff00),elements);
  helper::CopyToBuffer<unsigned_long>
            ((vector<char,_std::allocator<char>_> *)in_stack_ffffffffffffff10,
             (size_t *)in_stack_ffffffffffffff08,
             (unsigned_long *)CONCAT44(iVar2,in_stack_ffffffffffffff00),elements);
  helper::CopyToBuffer<unsigned_long>
            ((vector<char,_std::allocator<char>_> *)in_stack_ffffffffffffff10,
             (size_t *)in_stack_ffffffffffffff08,
             (unsigned_long *)CONCAT44(iVar2,in_stack_ffffffffffffff00),elements);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::size((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
          *)(in_RDI + 0xc48));
  helper::CopyToBuffer<unsigned_long>
            ((vector<char,_std::allocator<char>_> *)in_stack_ffffffffffffff10,
             (size_t *)in_stack_ffffffffffffff08,
             (unsigned_long *)CONCAT44(iVar2,in_stack_ffffffffffffff00),elements);
  iVar7 = 0;
  while( true ) {
    transportIndex = (int)(in_stack_ffffffffffffff68 >> 0x20);
    iVar8 = iVar7;
    iVar3 = helper::Comm::Size((Comm *)0xa82508);
    if (iVar3 <= iVar7) break;
    uVar6 = 0;
    while( true ) {
      in_stack_ffffffffffffff68 = uVar6;
      sVar4 = std::
              vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
              ::size((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                      *)(in_RDI + 0xc48));
      if (sVar4 <= uVar6) break;
      this_00 = std::
                vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                ::operator[]((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                              *)(in_RDI + 0xc48),in_stack_ffffffffffffff68);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                (this_00,(long)(iVar8 << 1));
      helper::CopyToBuffer<unsigned_long>
                ((vector<char,_std::allocator<char>_> *)in_stack_ffffffffffffff10,
                 (size_t *)in_stack_ffffffffffffff08,
                 (unsigned_long *)CONCAT44(iVar2,in_stack_ffffffffffffff00),elements);
      uVar6 = in_stack_ffffffffffffff68 + 1;
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0xc28),(long)iVar8
              );
    helper::CopyToBuffer<unsigned_long>
              ((vector<char,_std::allocator<char>_> *)in_stack_ffffffffffffff10,
               (size_t *)in_stack_ffffffffffffff08,
               (unsigned_long *)CONCAT44(iVar2,in_stack_ffffffffffffff00),elements);
    iVar7 = iVar8 + 1;
  }
  this_01 = (vector<char,_std::allocator<char>_> *)
            std::vector<char,_std::allocator<char>_>::data
                      ((vector<char,_std::allocator<char>_> *)0xa82632);
  std::vector<char,_std::allocator<char>_>::size(&local_38);
  transportman::TransportMan::WriteFiles
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
             CONCAT44(in_stack_ffffffffffffff74,iVar8),transportIndex);
  transportman::TransportMan::FlushFiles
            ((TransportMan *)CONCAT44(in_stack_ffffffffffffff74,iVar8),transportIndex);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::clear((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           *)0xa82689);
  std::vector<char,_std::allocator<char>_>::~vector(this_01);
  return;
}

Assistant:

void BP5Writer::WriteMetadataFileIndex(uint64_t MetaDataPos, uint64_t MetaDataSize)
{
    // bufsize: Step record
    size_t bufsize =
        1 + (4 + ((FlushPosSizeInfo.size() * 2) + 1) * m_Comm.Size()) * sizeof(uint64_t);
    if (MetaDataPos == 0)
    {
        //  First time, write the headers
        bufsize += m_IndexHeaderSize;
    }
    if (!m_WriterSubfileMap.empty())
    {
        // WriterMap record
        bufsize += 1 + (4 + m_Comm.Size()) * sizeof(uint64_t);
    }

    std::vector<char> buf(bufsize);
    size_t pos = 0;
    uint64_t d;
    unsigned char record;

    if (MetaDataPos == 0)
    {
        //  First time, write the headers
        MakeHeader(buf, pos, "Index Table", true);
    }

    // WriterMap record
    if (!m_WriterSubfileMap.empty())
    {
        record = WriterMapRecord;
        helper::CopyToBuffer(buf, pos, &record, 1); // record type
        d = (3 + m_Comm.Size()) * sizeof(uint64_t);
        helper::CopyToBuffer(buf, pos, &d, 1); // record length
        d = static_cast<uint64_t>(m_Comm.Size());
        helper::CopyToBuffer(buf, pos, &d, 1);
        d = static_cast<uint64_t>(m_Aggregator->m_NumAggregators);
        helper::CopyToBuffer(buf, pos, &d, 1);
        d = static_cast<uint64_t>(m_Aggregator->m_SubStreams);
        helper::CopyToBuffer(buf, pos, &d, 1);
        helper::CopyToBuffer(buf, pos, m_WriterSubfileMap.data(), m_Comm.Size());
        m_WriterSubfileMap.clear();
    }

    // Step record
    record = StepRecord;
    helper::CopyToBuffer(buf, pos, &record, 1); // record type
    d = (3 + ((FlushPosSizeInfo.size() * 2) + 1) * m_Comm.Size()) * sizeof(uint64_t);
    helper::CopyToBuffer(buf, pos, &d, 1); // record length
    helper::CopyToBuffer(buf, pos, &MetaDataPos, 1);
    helper::CopyToBuffer(buf, pos, &MetaDataSize, 1);
    d = static_cast<uint64_t>(FlushPosSizeInfo.size());
    helper::CopyToBuffer(buf, pos, &d, 1);

    for (int writer = 0; writer < m_Comm.Size(); writer++)
    {
        for (size_t flushNum = 0; flushNum < FlushPosSizeInfo.size(); flushNum++)
        {
            // add two numbers here
            helper::CopyToBuffer(buf, pos, &FlushPosSizeInfo[flushNum][2 * writer], 2);
        }
        helper::CopyToBuffer(buf, pos, &m_WriterDataPos[writer], 1);
    }

    m_FileMetadataIndexManager.WriteFiles((char *)buf.data(), buf.size());
#ifdef DUMPDATALOCINFO
    std::cout << "Flush count is :" << FlushPosSizeInfo.size() << std::endl;
    std::cout << "Write Index positions = {" << std::endl;

    for (size_t i = 0; i < m_Comm.Size(); ++i)
    {
        std::cout << "Writer " << i << " has data at: " << std::endl;
        uint64_t eachWriterSize = FlushPosSizeInfo.size() * 2 + 1;
        for (size_t j = 0; j < FlushPosSizeInfo.size(); ++j)
        {
            std::cout << "loc:" << buf[3 + eachWriterSize * i + j * 2]
                      << " siz:" << buf[3 + eachWriterSize * i + j * 2 + 1] << std::endl;
        }
        std::cout << "loc:" << buf[3 + eachWriterSize * (i + 1) - 1] << std::endl;
    }
    std::cout << "}" << std::endl;
#endif
    m_FileMetadataIndexManager.FlushFiles();

    /* reset for next timestep */
    FlushPosSizeInfo.clear();
}